

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

PClassActor * T_GetMobjType(svalue_t *arg)

{
  uint uVar1;
  char *pcVar2;
  AActor *this;
  int objtype;
  AActor *mo;
  PClassActor *pclass;
  svalue_t *arg_local;
  
  mo = (AActor *)0x0;
  if (arg->type == 0) {
    mo = (AActor *)PClass::FindActor(&arg->string);
    if (mo == (AActor *)0x0) {
      pcVar2 = FString::GetChars(&arg->string);
      script_error("unknown object type: %s\n",pcVar2);
    }
  }
  else if (arg->type == 2) {
    this = actorvalue(arg);
    if (this != (AActor *)0x0) {
      mo = (AActor *)AActor::GetClass(this);
    }
  }
  else {
    uVar1 = intvalue(arg);
    if (((int)uVar1 < 0) || (0x8a < (int)uVar1)) {
      mo = (AActor *)0x0;
    }
    else {
      mo = (AActor *)ActorTypes[(int)uVar1];
    }
    if (mo == (AActor *)0x0) {
      script_error("unknown object type: %i\n",(ulong)uVar1);
    }
  }
  return (PClassActor *)mo;
}

Assistant:

PClassActor * T_GetMobjType(svalue_t arg)
{
	PClassActor * pclass=NULL;
	
	if (arg.type==svt_string)
	{
		pclass=PClass::FindActor(arg.string);

		// invalid object to spawn
		if(!pclass) script_error("unknown object type: %s\n", arg.string.GetChars()); 
	}
	else if (arg.type==svt_mobj)
	{
		AActor * mo = actorvalue(arg);
		if (mo) pclass = mo->GetClass();
	}
	else
	{
		int objtype = intvalue(arg);
		if (objtype>=0 && objtype<int(countof(ActorTypes))) pclass=ActorTypes[objtype];
		else pclass=NULL;

		// invalid object to spawn
		if(!pclass) script_error("unknown object type: %i\n", objtype); 
	}
	return pclass;
}